

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool tinyobj::exportGroupsToShape
               (shape_t *shape,PrimGroup *prim_group,
               vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *tags,int material_id,
               string *name,bool triangulate,vector<float,_std::allocator<float>_> *v)

{
  float fVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  PrimGroup *pPVar9;
  size_t sVar10;
  size_t sVar11;
  bool bVar12;
  int iVar13;
  face_t *pfVar14;
  const_reference __x;
  size_type sVar15;
  const_reference pvVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  size_type sVar20;
  const_reference pvVar21;
  reference pvVar22;
  reference pvVar23;
  vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_> *pvVar24;
  vertex_index_t *pvVar25;
  ulong __n;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  double dVar33;
  vertex_index_t *local_310;
  undefined1 local_2c4 [8];
  index_t idx_3;
  vertex_index_t *vi_2;
  size_t j_1;
  size_t i_2;
  int local_298;
  index_t idx_2;
  vertex_index_t *vi_1;
  size_t j;
  size_t i_1;
  int local_270;
  index_t idx_1;
  size_t k_3;
  int local_258;
  index_t idx2_1;
  index_t idx1_1;
  index_t idx0_1;
  size_t removed_vert_index;
  int local_228;
  index_t idx2;
  index_t idx1;
  index_t idx0;
  real_t ty;
  real_t tx;
  size_t ovi;
  size_t idx;
  size_t otherVert;
  bool overlap;
  real_t cross;
  real_t e1y_1;
  real_t e1x_1;
  real_t e0y_1;
  real_t e0x_1;
  size_t vi;
  size_t k_2;
  size_t previousRemainingVertices;
  size_t remainingIterations;
  float local_1a8;
  real_t vy [3];
  real_t vx [3];
  undefined1 local_188 [8];
  vertex_index_t ind [3];
  ulong local_158;
  size_t guess_vert;
  face_t remainingFace;
  real_t v1y_1;
  real_t v1x_1;
  real_t v0y_1;
  real_t v0x_1;
  size_t vi1_1;
  size_t vi0_1;
  size_t k_1;
  real_t area;
  real_t epsilon;
  real_t cz;
  real_t cy;
  real_t cx;
  real_t e1z;
  real_t e1y;
  real_t e1x;
  real_t e0z;
  real_t e0y;
  real_t e0x;
  real_t v2z;
  real_t v2y;
  real_t v2x;
  real_t v1z;
  real_t v1y;
  real_t v1x;
  real_t v0z;
  real_t v0y;
  real_t v0x;
  size_t vi2;
  size_t vi1;
  size_t vi0;
  size_t k;
  size_t axes [2];
  vertex_index_t i2;
  int iStack_74;
  vertex_index_t i1;
  vertex_index_t i0;
  size_t npolys;
  face_t *face;
  size_t i;
  bool triangulate_local;
  string *name_local;
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *pvStack_28;
  int material_id_local;
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *tags_local;
  PrimGroup *prim_group_local;
  shape_t *shape_local;
  
  name_local._4_4_ = material_id;
  pvStack_28 = tags;
  tags_local = (vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)prim_group;
  prim_group_local = (PrimGroup *)shape;
  bVar12 = PrimGroup::IsEmpty(prim_group);
  if (bVar12) {
    shape_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::operator=((string *)prim_group_local,(string *)name);
    bVar12 = std::vector<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>::empty
                       ((vector<tinyobj::face_t,_std::allocator<tinyobj::face_t>_> *)tags_local);
    if (!bVar12) {
      for (face = (face_t *)0x0;
          pfVar14 = (face_t *)
                    std::vector<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>::size
                              ((vector<tinyobj::face_t,_std::allocator<tinyobj::face_t>_> *)
                               tags_local), face < pfVar14;
          face = (face_t *)((long)&face->smoothing_group_id + 1)) {
        __x = std::vector<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>::operator[]
                        ((vector<tinyobj::face_t,_std::allocator<tinyobj::face_t>_> *)tags_local,
                         (size_type)face);
        sVar15 = std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                 size(&__x->vertex_indices);
        if (2 < sVar15) {
          std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::operator[]
                    (&__x->vertex_indices,0);
          vertex_index_t::vertex_index_t((vertex_index_t *)&i2.vn_idx,-1);
          pvVar16 = std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                    operator[](&__x->vertex_indices,1);
          i2.v_idx = pvVar16->vn_idx;
          if (triangulate) {
            k = 1;
            axes[0] = 2;
            for (vi0 = 0; vi0 < sVar15; vi0 = vi0 + 1) {
              pvVar16 = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        operator[](&__x->vertex_indices,vi0 % sVar15);
              uVar3 = pvVar16->v_idx;
              pvVar16 = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        operator[](&__x->vertex_indices,(vi0 + 1) % sVar15);
              i2.vn_idx = pvVar16->v_idx;
              iStack_74 = pvVar16->vt_idx;
              pvVar16 = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        operator[](&__x->vertex_indices,(vi0 + 2) % sVar15);
              uVar4 = pvVar16->v_idx;
              i2.v_idx = pvVar16->vn_idx;
              lVar17 = (long)(int)uVar3;
              lVar18 = (long)i2.vn_idx;
              lVar19 = (long)(int)uVar4;
              sVar20 = std::vector<float,_std::allocator<float>_>::size(v);
              if (((lVar17 * 3 + 2U < sVar20) &&
                  (sVar20 = std::vector<float,_std::allocator<float>_>::size(v),
                  lVar18 * 3 + 2U < sVar20)) &&
                 (sVar20 = std::vector<float,_std::allocator<float>_>::size(v),
                 lVar19 * 3 + 2U < sVar20)) {
                pvVar21 = std::vector<float,_std::allocator<float>_>::operator[](v,lVar17 * 3);
                fVar26 = *pvVar21;
                pvVar21 = std::vector<float,_std::allocator<float>_>::operator[](v,lVar17 * 3 + 1);
                fVar27 = *pvVar21;
                pvVar21 = std::vector<float,_std::allocator<float>_>::operator[](v,lVar17 * 3 + 2);
                fVar28 = *pvVar21;
                pvVar21 = std::vector<float,_std::allocator<float>_>::operator[](v,lVar18 * 3);
                fVar32 = *pvVar21;
                pvVar21 = std::vector<float,_std::allocator<float>_>::operator[](v,lVar18 * 3 + 1);
                fVar1 = *pvVar21;
                pvVar21 = std::vector<float,_std::allocator<float>_>::operator[](v,lVar18 * 3 + 2);
                fVar31 = *pvVar21;
                pvVar21 = std::vector<float,_std::allocator<float>_>::operator[](v,lVar19 * 3);
                fVar29 = *pvVar21;
                pvVar21 = std::vector<float,_std::allocator<float>_>::operator[](v,lVar19 * 3 + 1);
                fVar30 = *pvVar21;
                pvVar21 = std::vector<float,_std::allocator<float>_>::operator[](v,lVar19 * 3 + 2);
                fVar26 = fVar32 - fVar26;
                fVar27 = fVar1 - fVar27;
                fVar28 = fVar31 - fVar28;
                fVar29 = fVar29 - fVar32;
                fVar30 = fVar30 - fVar1;
                fVar31 = *pvVar21 - fVar31;
                dVar33 = std::fabs((double)(ulong)(uint)(fVar27 * fVar31 + -(fVar28 * fVar30)));
                fVar32 = SUB84(dVar33,0);
                dVar33 = std::fabs((double)(ulong)(uint)(fVar28 * fVar29 + -(fVar26 * fVar31)));
                fVar28 = SUB84(dVar33,0);
                dVar33 = std::fabs((double)(ulong)(uint)(fVar26 * fVar30 + -(fVar27 * fVar29)));
                fVar26 = SUB84(dVar33,0);
                std::numeric_limits<float>::epsilon();
                if (((1.1920929e-07 < fVar32) || (1.1920929e-07 < fVar28)) ||
                   (1.1920929e-07 < fVar26)) {
                  if (((fVar32 <= fVar28) || (fVar32 <= fVar26)) &&
                     ((k = 0, fVar32 < fVar26 && (fVar28 < fVar26)))) {
                    axes[0] = 1;
                  }
                  break;
                }
              }
            }
            k_1._0_4_ = 0.0;
            for (vi0_1 = 0; vi0_1 < sVar15; vi0_1 = vi0_1 + 1) {
              pvVar16 = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        operator[](&__x->vertex_indices,vi0_1 % sVar15);
              uVar5 = pvVar16->v_idx;
              pvVar16 = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        operator[](&__x->vertex_indices,(vi0_1 + 1) % sVar15);
              i2.vn_idx = pvVar16->v_idx;
              iStack_74 = pvVar16->vt_idx;
              lVar17 = (long)(int)uVar5;
              lVar18 = (long)i2.vn_idx;
              sVar20 = std::vector<float,_std::allocator<float>_>::size(v);
              if ((((lVar17 * 3 + k < sVar20) &&
                   (sVar20 = std::vector<float,_std::allocator<float>_>::size(v),
                   lVar17 * 3 + axes[0] < sVar20)) &&
                  (sVar20 = std::vector<float,_std::allocator<float>_>::size(v),
                  lVar18 * 3 + k < sVar20)) &&
                 (sVar20 = std::vector<float,_std::allocator<float>_>::size(v),
                 lVar18 * 3 + axes[0] < sVar20)) {
                pvVar21 = std::vector<float,_std::allocator<float>_>::operator[](v,lVar17 * 3 + k);
                fVar26 = *pvVar21;
                pvVar21 = std::vector<float,_std::allocator<float>_>::operator[]
                                    (v,lVar17 * 3 + axes[0]);
                fVar27 = *pvVar21;
                pvVar21 = std::vector<float,_std::allocator<float>_>::operator[](v,lVar18 * 3 + k);
                remainingFace.vertex_indices.
                super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = *pvVar21;
                pvVar21 = std::vector<float,_std::allocator<float>_>::operator[]
                                    (v,lVar18 * 3 + axes[0]);
                remainingFace.vertex_indices.
                super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = *pvVar21;
                k_1._0_4_ = (fVar26 * remainingFace.vertex_indices.
                                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ +
                            -(fVar27 * remainingFace.vertex_indices.
                                       super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) *
                            0.5 + (float)k_1;
              }
            }
            face_t::face_t((face_t *)&guess_vert,__x);
            local_158 = 0;
            local_310 = (vertex_index_t *)local_188;
            do {
              vertex_index_t::vertex_index_t(local_310);
              local_310 = local_310 + 1;
            } while (local_310 != (vertex_index_t *)&ind[2].vt_idx);
            previousRemainingVertices =
                 std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                 size(&__x->vertex_indices);
            k_2 = std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                  size((vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_> *)
                       &remainingFace);
            while (sVar15 = std::
                            vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                            ::size((vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                    *)&remainingFace), 3 < sVar15 && previousRemainingVertices != 0)
            {
              sVar15 = std::
                       vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                       size((vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                             *)&remainingFace);
              if (sVar15 <= local_158) {
                local_158 = local_158 - sVar15;
              }
              sVar10 = sVar15;
              sVar11 = sVar15;
              if (k_2 == sVar15) {
                sVar10 = k_2;
                sVar11 = previousRemainingVertices - 1;
              }
              previousRemainingVertices = sVar11;
              k_2 = sVar10;
              for (vi = 0; vi < 3; vi = vi + 1) {
                pvVar23 = std::
                          vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                          ::operator[]((vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                        *)&remainingFace,(local_158 + vi) % sVar15);
                iVar13 = pvVar23->vt_idx;
                ind[vi - 1].vt_idx = pvVar23->v_idx;
                ind[vi - 1].vn_idx = iVar13;
                ind[vi].v_idx = pvVar23->vn_idx;
                lVar17 = (long)ind[vi - 1].vt_idx;
                sVar20 = std::vector<float,_std::allocator<float>_>::size(v);
                if ((lVar17 * 3 + k < sVar20) &&
                   (sVar20 = std::vector<float,_std::allocator<float>_>::size(v),
                   lVar17 * 3 + axes[0] < sVar20)) {
                  pvVar21 = std::vector<float,_std::allocator<float>_>::operator[](v,lVar17 * 3 + k)
                  ;
                  vy[vi + 1] = *pvVar21;
                  pvVar21 = std::vector<float,_std::allocator<float>_>::operator[]
                                      (v,lVar17 * 3 + axes[0]);
                  *(value_type *)((long)&remainingIterations + vi * 4 + 4) = *pvVar21;
                }
                else {
                  vy[vi + 1] = 0.0;
                  *(undefined4 *)((long)&remainingIterations + vi * 4 + 4) = 0;
                }
              }
              if (0.0 <= ((vy[2] - vy[1]) * (vy[0] - local_1a8) +
                         -((local_1a8 - remainingIterations._4_4_) * (vx[0] - vy[2]))) * (float)k_1)
              {
                bVar12 = false;
                for (idx = 3; idx < sVar15; idx = idx + 1) {
                  __n = (local_158 + idx) % sVar15;
                  sVar20 = std::
                           vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                           ::size((vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                   *)&remainingFace);
                  if (__n < sVar20) {
                    pvVar23 = std::
                              vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                              ::operator[]((vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                            *)&remainingFace,__n);
                    lVar17 = (long)pvVar23->v_idx;
                    sVar20 = std::vector<float,_std::allocator<float>_>::size(v);
                    if ((lVar17 * 3 + k < sVar20) &&
                       (sVar20 = std::vector<float,_std::allocator<float>_>::size(v),
                       lVar17 * 3 + axes[0] < sVar20)) {
                      pvVar21 = std::vector<float,_std::allocator<float>_>::operator[]
                                          (v,lVar17 * 3 + k);
                      fVar26 = *pvVar21;
                      pvVar21 = std::vector<float,_std::allocator<float>_>::operator[]
                                          (v,lVar17 * 3 + axes[0]);
                      iVar13 = pnpoly<float>(3,vy + 1,(float *)((long)&remainingIterations + 4),
                                             fVar26,*pvVar21);
                      if (iVar13 != 0) {
                        bVar12 = true;
                        break;
                      }
                    }
                  }
                }
                if (bVar12) {
                  local_158 = local_158 + 1;
                }
                else {
                  idx1.normal_index = local_188._0_4_;
                  idx1.texcoord_index = ind[0].v_idx;
                  idx2.normal_index = ind[0].vt_idx;
                  idx2.texcoord_index = ind[1].v_idx;
                  idx1.vertex_index = ind[0].vn_idx;
                  removed_vert_index._4_4_ = ind[1].vt_idx;
                  local_228 = ind[2].v_idx;
                  idx2.vertex_index = ind[1].vn_idx;
                  std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                            ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                             &(prim_group_local->lineGroup).
                              super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                             (value_type *)&idx1.normal_index);
                  std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                            ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                             &(prim_group_local->lineGroup).
                              super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                             (value_type *)&idx2.normal_index);
                  std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                            ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                             &(prim_group_local->lineGroup).
                              super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                             (value_type *)((long)&removed_vert_index + 4));
                  removed_vert_index._3_1_ = 3;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &(prim_group_local->pointsGroup).
                              super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                             (value_type_conflict2 *)((long)&removed_vert_index + 3));
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)
                             &prim_group_local[1].faceGroup.
                              super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>.
                              _M_impl.super__Vector_impl_data._M_finish,
                             (value_type_conflict3 *)((long)&name_local + 4));
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &prim_group_local[1].lineGroup.
                              super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish,&__x->smoothing_group_id);
                  for (idx0_1._4_8_ = (local_158 + 1) % sVar15; idx0_1._4_8_ + 1 < sVar15;
                      idx0_1._4_8_ = idx0_1._4_8_ + 1) {
                    pvVar23 = std::
                              vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                              ::operator[]((vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                            *)&remainingFace,idx0_1._4_8_ + 1);
                    pvVar22 = std::
                              vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                              ::operator[]((vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                            *)&remainingFace,idx0_1._4_8_);
                    iVar13 = pvVar23->vt_idx;
                    pvVar22->v_idx = pvVar23->v_idx;
                    pvVar22->vt_idx = iVar13;
                    pvVar22->vn_idx = pvVar23->vn_idx;
                  }
                  std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                  pop_back((vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                            *)&remainingFace);
                }
              }
              else {
                local_158 = local_158 + 1;
              }
            }
            sVar15 = std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     ::size((vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                             *)&remainingFace);
            if (sVar15 == 3) {
              pvVar23 = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        operator[]((vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                    *)&remainingFace,0);
              iVar13 = pvVar23->vn_idx;
              uVar6 = pvVar23->v_idx;
              pvVar23 = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        operator[]((vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                    *)&remainingFace,1);
              iVar2 = pvVar23->vn_idx;
              i2.vn_idx = pvVar23->v_idx;
              iStack_74 = pvVar23->vt_idx;
              pvVar23 = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        operator[]((vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                    *)&remainingFace,2);
              local_258 = pvVar23->vn_idx;
              uVar7 = pvVar23->v_idx;
              uVar8 = pvVar23->vt_idx;
              idx1_1.normal_index = uVar6;
              idx2_1.normal_index = i2.vn_idx;
              idx1_1.vertex_index = iStack_74;
              k_3._4_4_ = uVar7;
              idx2_1.vertex_index = uVar8;
              idx2_1.texcoord_index = iVar2;
              idx1_1.texcoord_index = iVar13;
              i2.v_idx = local_258;
              std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                        ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                         &(prim_group_local->lineGroup).
                          super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>.
                          _M_impl.super__Vector_impl_data._M_finish,
                         (value_type *)&idx1_1.normal_index);
              std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                        ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                         &(prim_group_local->lineGroup).
                          super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>.
                          _M_impl.super__Vector_impl_data._M_finish,
                         (value_type *)&idx2_1.normal_index);
              std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                        ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                         &(prim_group_local->lineGroup).
                          super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>.
                          _M_impl.super__Vector_impl_data._M_finish,(value_type *)((long)&k_3 + 4));
              k_3._3_1_ = 3;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &(prim_group_local->pointsGroup).
                          super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                         (value_type_conflict2 *)((long)&k_3 + 3));
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         &prim_group_local[1].faceGroup.
                          super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>.
                          _M_impl.super__Vector_impl_data._M_finish,
                         (value_type_conflict3 *)((long)&name_local + 4));
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &prim_group_local[1].lineGroup.
                          super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>.
                          _M_impl.super__Vector_impl_data._M_finish,&__x->smoothing_group_id);
            }
            face_t::~face_t((face_t *)&guess_vert);
          }
          else {
            idx_1.normal_index = 0;
            idx_1.texcoord_index = 0;
            for (; (ulong)idx_1._4_8_ < sVar15; idx_1._4_8_ = idx_1._4_8_ + 1) {
              pvVar16 = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        operator[](&__x->vertex_indices,idx_1._4_8_);
              i_1._4_4_ = pvVar16->v_idx;
              pvVar16 = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        operator[](&__x->vertex_indices,idx_1._4_8_);
              local_270 = pvVar16->vn_idx;
              pvVar16 = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        operator[](&__x->vertex_indices,idx_1._4_8_);
              idx_1.vertex_index = pvVar16->vt_idx;
              std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                        ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                         &(prim_group_local->lineGroup).
                          super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>.
                          _M_impl.super__Vector_impl_data._M_finish,(value_type *)((long)&i_1 + 4));
            }
            i_1._3_1_ = (undefined1)sVar15;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &(prim_group_local->pointsGroup).
                        super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                       (value_type_conflict2 *)((long)&i_1 + 3));
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       &prim_group_local[1].faceGroup.
                        super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish,
                       (value_type_conflict3 *)((long)&name_local + 4));
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &prim_group_local[1].lineGroup.
                        super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish,&__x->smoothing_group_id);
          }
        }
      }
      std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::operator=
                ((vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)
                 &prim_group_local[1].pointsGroup.
                  super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish,pvStack_28);
    }
    bVar12 = std::vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>::empty
                       ((vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_> *)
                        (tags_local + 1));
    if (!bVar12) {
      for (j = 0; sVar15 = std::vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>::size
                                     ((vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>
                                       *)(tags_local + 1)), j < sVar15; j = j + 1) {
        vi_1 = (vertex_index_t *)0x0;
        while( true ) {
          pvVar24 = &std::vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>::operator[]
                               ((vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_> *)
                                (tags_local + 1),j)->vertex_indices;
          pvVar25 = (vertex_index_t *)
                    std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                    size(pvVar24);
          if (pvVar25 <= vi_1) break;
          pvVar24 = &std::vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>::operator[]
                               ((vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_> *)
                                (tags_local + 1),j)->vertex_indices;
          idx_2._4_8_ = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        operator[](pvVar24,(size_type)vi_1);
          i_2._4_4_ = ((const_reference)idx_2._4_8_)->v_idx;
          local_298 = ((const_reference)idx_2._4_8_)->vn_idx;
          idx_2.vertex_index = ((const_reference)idx_2._4_8_)->vt_idx;
          std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                    ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                     &prim_group_local[2].faceGroup.
                      super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
                      super__Vector_impl_data._M_finish,(value_type *)((long)&i_2 + 4));
          vi_1 = (vertex_index_t *)((long)&vi_1->v_idx + 1);
        }
        pPVar9 = prim_group_local + 2;
        pvVar24 = &std::vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>::operator[]
                             ((vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_> *)
                              (tags_local + 1),j)->vertex_indices;
        sVar15 = std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                 size(pvVar24);
        i_2._0_4_ = (undefined4)sVar15;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &(pPVar9->lineGroup).
                    super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish,(value_type_conflict3 *)&i_2);
      }
    }
    bVar12 = std::vector<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>::empty
                       ((vector<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_> *)
                        (tags_local + 2));
    if (!bVar12) {
      for (j_1 = 0; sVar15 = std::vector<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>
                             ::size((vector<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>
                                     *)(tags_local + 2)), j_1 < sVar15; j_1 = j_1 + 1) {
        vi_2 = (vertex_index_t *)0x0;
        while( true ) {
          pvVar24 = &std::vector<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>::
                     operator[]((vector<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_> *
                                )(tags_local + 2),j_1)->vertex_indices;
          pvVar25 = (vertex_index_t *)
                    std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                    size(pvVar24);
          if (pvVar25 <= vi_2) break;
          pvVar24 = &std::vector<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>::
                     operator[]((vector<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_> *
                                )(tags_local + 2),j_1)->vertex_indices;
          idx_3._4_8_ = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        operator[](pvVar24,(size_type)vi_2);
          local_2c4._0_4_ = ((const_reference)idx_3._4_8_)->v_idx;
          local_2c4._4_4_ = ((const_reference)idx_3._4_8_)->vn_idx;
          idx_3.vertex_index = ((const_reference)idx_3._4_8_)->vt_idx;
          std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                    ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                     &prim_group_local[2].pointsGroup.
                      super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish,(value_type *)local_2c4);
          vi_2 = (vertex_index_t *)((long)&vi_2->v_idx + 1);
        }
      }
    }
    shape_local._7_1_ = true;
  }
  return shape_local._7_1_;
}

Assistant:

static bool exportGroupsToShape(shape_t *shape, const PrimGroup &prim_group,
                                const std::vector<tag_t> &tags,
                                const int material_id, const std::string &name,
                                bool triangulate,
                                const std::vector<real_t> &v) {
  if (prim_group.IsEmpty()) {
    return false;
  }

  shape->name = name;

  // polygon
  if (!prim_group.faceGroup.empty()) {
    // Flatten vertices and indices
    for (size_t i = 0; i < prim_group.faceGroup.size(); i++) {
      const face_t &face = prim_group.faceGroup[i];

      size_t npolys = face.vertex_indices.size();

      if (npolys < 3) {
        // Face must have 3+ vertices.
        continue;
      }

      vertex_index_t i0 = face.vertex_indices[0];
      vertex_index_t i1(-1);
      vertex_index_t i2 = face.vertex_indices[1];

      if (triangulate) {
        // find the two axes to work in
        size_t axes[2] = {1, 2};
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          i2 = face.vertex_indices[(k + 2) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          size_t vi2 = size_t(i2.v_idx);

          if (((3 * vi0 + 2) >= v.size()) || ((3 * vi1 + 2) >= v.size()) ||
              ((3 * vi2 + 2) >= v.size())) {
            // Invalid triangle.
            // FIXME(syoyo): Is it ok to simply skip this invalid triangle?
            continue;
          }
          real_t v0x = v[vi0 * 3 + 0];
          real_t v0y = v[vi0 * 3 + 1];
          real_t v0z = v[vi0 * 3 + 2];
          real_t v1x = v[vi1 * 3 + 0];
          real_t v1y = v[vi1 * 3 + 1];
          real_t v1z = v[vi1 * 3 + 2];
          real_t v2x = v[vi2 * 3 + 0];
          real_t v2y = v[vi2 * 3 + 1];
          real_t v2z = v[vi2 * 3 + 2];
          real_t e0x = v1x - v0x;
          real_t e0y = v1y - v0y;
          real_t e0z = v1z - v0z;
          real_t e1x = v2x - v1x;
          real_t e1y = v2y - v1y;
          real_t e1z = v2z - v1z;
          real_t cx = std::fabs(e0y * e1z - e0z * e1y);
          real_t cy = std::fabs(e0z * e1x - e0x * e1z);
          real_t cz = std::fabs(e0x * e1y - e0y * e1x);
          const real_t epsilon = std::numeric_limits<real_t>::epsilon();
          if (cx > epsilon || cy > epsilon || cz > epsilon) {
            // found a corner
            if (cx > cy && cx > cz) {
            } else {
              axes[0] = 0;
              if (cz > cx && cz > cy) axes[1] = 1;
            }
            break;
          }
        }

        real_t area = 0;
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          if (((vi0 * 3 + axes[0]) >= v.size()) ||
              ((vi0 * 3 + axes[1]) >= v.size()) ||
              ((vi1 * 3 + axes[0]) >= v.size()) ||
              ((vi1 * 3 + axes[1]) >= v.size())) {
            // Invalid index.
            continue;
          }
          real_t v0x = v[vi0 * 3 + axes[0]];
          real_t v0y = v[vi0 * 3 + axes[1]];
          real_t v1x = v[vi1 * 3 + axes[0]];
          real_t v1y = v[vi1 * 3 + axes[1]];
          area += (v0x * v1y - v0y * v1x) * static_cast<real_t>(0.5);
        }

        face_t remainingFace = face;  // copy
        size_t guess_vert = 0;
        vertex_index_t ind[3];
        real_t vx[3];
        real_t vy[3];

        // How many iterations can we do without decreasing the remaining
        // vertices.
        size_t remainingIterations = face.vertex_indices.size();
        size_t previousRemainingVertices = remainingFace.vertex_indices.size();

        while (remainingFace.vertex_indices.size() > 3 &&
               remainingIterations > 0) {
          npolys = remainingFace.vertex_indices.size();
          if (guess_vert >= npolys) {
            guess_vert -= npolys;
          }

          if (previousRemainingVertices != npolys) {
            // The number of remaining vertices decreased. Reset counters.
            previousRemainingVertices = npolys;
            remainingIterations = npolys;
          } else {
            // We didn't consume a vertex on previous iteration, reduce the
            // available iterations.
            remainingIterations--;
          }

          for (size_t k = 0; k < 3; k++) {
            ind[k] = remainingFace.vertex_indices[(guess_vert + k) % npolys];
            size_t vi = size_t(ind[k].v_idx);
            if (((vi * 3 + axes[0]) >= v.size()) ||
                ((vi * 3 + axes[1]) >= v.size())) {
              // ???
              vx[k] = static_cast<real_t>(0.0);
              vy[k] = static_cast<real_t>(0.0);
            } else {
              vx[k] = v[vi * 3 + axes[0]];
              vy[k] = v[vi * 3 + axes[1]];
            }
          }
          real_t e0x = vx[1] - vx[0];
          real_t e0y = vy[1] - vy[0];
          real_t e1x = vx[2] - vx[1];
          real_t e1y = vy[2] - vy[1];
          real_t cross = e0x * e1y - e0y * e1x;
          // if an internal angle
          if (cross * area < static_cast<real_t>(0.0)) {
            guess_vert += 1;
            continue;
          }

          // check all other verts in case they are inside this triangle
          bool overlap = false;
          for (size_t otherVert = 3; otherVert < npolys; ++otherVert) {
            size_t idx = (guess_vert + otherVert) % npolys;

            if (idx >= remainingFace.vertex_indices.size()) {
              // ???
              continue;
            }

            size_t ovi = size_t(remainingFace.vertex_indices[idx].v_idx);

            if (((ovi * 3 + axes[0]) >= v.size()) ||
                ((ovi * 3 + axes[1]) >= v.size())) {
              // ???
              continue;
            }
            real_t tx = v[ovi * 3 + axes[0]];
            real_t ty = v[ovi * 3 + axes[1]];
            if (pnpoly(3, vx, vy, tx, ty)) {
              overlap = true;
              break;
            }
          }

          if (overlap) {
            guess_vert += 1;
            continue;
          }

          // this triangle is an ear
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = ind[0].v_idx;
            idx0.normal_index = ind[0].vn_idx;
            idx0.texcoord_index = ind[0].vt_idx;
            idx1.vertex_index = ind[1].v_idx;
            idx1.normal_index = ind[1].vn_idx;
            idx1.texcoord_index = ind[1].vt_idx;
            idx2.vertex_index = ind[2].v_idx;
            idx2.normal_index = ind[2].vn_idx;
            idx2.texcoord_index = ind[2].vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }

          // remove v1 from the list
          size_t removed_vert_index = (guess_vert + 1) % npolys;
          while (removed_vert_index + 1 < npolys) {
            remainingFace.vertex_indices[removed_vert_index] =
                remainingFace.vertex_indices[removed_vert_index + 1];
            removed_vert_index += 1;
          }
          remainingFace.vertex_indices.pop_back();
        }

        if (remainingFace.vertex_indices.size() == 3) {
          i0 = remainingFace.vertex_indices[0];
          i1 = remainingFace.vertex_indices[1];
          i2 = remainingFace.vertex_indices[2];
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = i0.v_idx;
            idx0.normal_index = i0.vn_idx;
            idx0.texcoord_index = i0.vt_idx;
            idx1.vertex_index = i1.v_idx;
            idx1.normal_index = i1.vn_idx;
            idx1.texcoord_index = i1.vt_idx;
            idx2.vertex_index = i2.v_idx;
            idx2.normal_index = i2.vn_idx;
            idx2.texcoord_index = i2.vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }
        }
      } else {
        for (size_t k = 0; k < npolys; k++) {
          index_t idx;
          idx.vertex_index = face.vertex_indices[k].v_idx;
          idx.normal_index = face.vertex_indices[k].vn_idx;
          idx.texcoord_index = face.vertex_indices[k].vt_idx;
          shape->mesh.indices.push_back(idx);
        }

        shape->mesh.num_face_vertices.push_back(
            static_cast<unsigned char>(npolys));
        shape->mesh.material_ids.push_back(material_id);  // per face
        shape->mesh.smoothing_group_ids.push_back(
            face.smoothing_group_id);  // per face
      }
    }

    shape->mesh.tags = tags;
  }

  // line
  if (!prim_group.lineGroup.empty()) {
    // Flatten indices
    for (size_t i = 0; i < prim_group.lineGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.lineGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.lineGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->lines.indices.push_back(idx);
      }

      shape->lines.num_line_vertices.push_back(
          int(prim_group.lineGroup[i].vertex_indices.size()));
    }
  }

  // points
  if (!prim_group.pointsGroup.empty()) {
    // Flatten & convert indices
    for (size_t i = 0; i < prim_group.pointsGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.pointsGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.pointsGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->points.indices.push_back(idx);
      }
    }
  }

  return true;
}